

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>::
DescribeNegationTo(ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                   *this,ostream *os)

{
  MatcherDescriberInterface in_RAX;
  ostream *poVar1;
  pointer *__ptr;
  ulong uVar2;
  long lVar3;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  if ((this->matchers_).
      super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->matchers_).
      super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_38._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_RAX._vptr_MatcherDescriberInterface;
    poVar1 = std::operator<<(os,"doesn\'t have ");
    Elements((ElementsAreMatcherImpl<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
              *)&local_38,
             ((long)(this->matchers_).
                    super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->matchers_).
                   super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    poVar1 = testing::operator<<(poVar1,(Message *)&local_38);
    std::operator<<(poVar1,", or\n");
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_38._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(_func_int **)
                    local_38._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 8))();
    }
    lVar3 = 0;
    uVar2 = 0;
    while (uVar2 != ((long)(this->matchers_).
                           super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->matchers_).
                          super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) {
      poVar1 = std::operator<<(os,"element #");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1," ");
      MatcherBase<const_unsigned_int_&>::DescribeNegationTo
                ((MatcherBase<const_unsigned_int_&> *)
                 ((long)&(((this->matchers_).
                           super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_MatcherBase<const_unsigned_int_&>).super_MatcherDescriberInterface.
                         _vptr_MatcherDescriberInterface + lVar3),os);
      uVar2 = uVar2 + 1;
      if (uVar2 < (ulong)(((long)(this->matchers_).
                                 super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->matchers_).
                                super__Vector_base<testing::Matcher<const_unsigned_int_&>,_std::allocator<testing::Matcher<const_unsigned_int_&>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        std::operator<<(os,", or\n");
      }
      lVar3 = lVar3 + 0x18;
    }
    return;
  }
  std::operator<<(os,"isn\'t empty");
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const override {
    if (count() == 0) {
      *os << "isn't empty";
      return;
    }

    *os << "doesn't have " << Elements(count()) << ", or\n";
    for (size_t i = 0; i != count(); ++i) {
      *os << "element #" << i << " ";
      matchers_[i].DescribeNegationTo(os);
      if (i + 1 < count()) {
        *os << ", or\n";
      }
    }
  }